

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O0

void __thiscall input_mod::~input_mod(input_mod *this)

{
  DUH *in_stack_ffffffffffffffe0;
  input_mod *this_local;
  
  (this->super_StreamSong).super_MusInfo._vptr_MusInfo = (_func_int **)&PTR__input_mod_00b65618;
  (*(this->super_StreamSong).super_MusInfo._vptr_MusInfo[7])();
  if ((this->super_StreamSong).m_Stream != (SoundStream *)0x0) {
    in_stack_ffffffffffffffe0 = (DUH *)(this->super_StreamSong).m_Stream;
    if (in_stack_ffffffffffffffe0 != (DUH *)0x0) {
      (*(*(_func_int ***)in_stack_ffffffffffffffe0)[1])();
    }
    (this->super_StreamSong).m_Stream = (SoundStream *)0x0;
  }
  if (this->sr != (DUH_SIGRENDERER *)0x0) {
    duh_end_sigrenderer((DUH_SIGRENDERER *)0x42a774);
  }
  if (this->duh != (DUH *)0x0) {
    unload_duh(in_stack_ffffffffffffffe0);
  }
  FCriticalSection::~FCriticalSection(&this->crit_sec);
  FString::~FString(&this->FormatVersion);
  FString::~FString(&this->TrackerVersion);
  FString::~FString(&this->Codec);
  StreamSong::~StreamSong(&this->super_StreamSong);
  return;
}

Assistant:

input_mod::~input_mod()
{
	Stop();
	if (m_Stream != NULL)
	{
		delete m_Stream;
		m_Stream = NULL;
	}
	if (sr) duh_end_sigrenderer(sr);
	if (duh) unload_duh(duh);
}